

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_avx2.c
# Opt level: O1

void aom_highbd_hadamard_8x8_avx2(int16_t *src_diff,ptrdiff_t src_stride,tran_low_t *coeff)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  __m256i src32 [8];
  __m256i local_120;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  undefined1 local_40 [32];
  
  local_120 = (__m256i)vpmovsxwd_avx2(*(undefined1 (*) [16])src_diff);
  local_100 = vpmovsxwd_avx2(*(undefined1 (*) [16])(src_diff + src_stride));
  pauVar1 = (undefined1 (*) [16])(*(undefined1 (*) [16])(src_diff + src_stride) + src_stride * 2);
  local_e0 = vpmovsxwd_avx2(*pauVar1);
  pauVar1 = (undefined1 (*) [16])(*pauVar1 + src_stride * 2);
  local_c0 = vpmovsxwd_avx2(*pauVar1);
  pauVar1 = (undefined1 (*) [16])(*pauVar1 + src_stride * 2);
  local_a0 = vpmovsxwd_avx2(*pauVar1);
  pauVar1 = (undefined1 (*) [16])(*pauVar1 + src_stride * 2);
  local_80 = vpmovsxwd_avx2(*pauVar1);
  pauVar1 = (undefined1 (*) [16])(*pauVar1 + src_stride * 2);
  local_60 = vpmovsxwd_avx2(*pauVar1);
  local_40 = vpmovsxwd_avx2(*(undefined1 (*) [16])(*pauVar1 + src_stride * 2));
  highbd_hadamard_col8_avx2(&local_120,0);
  auVar2 = vpaddd_avx2(local_100,(undefined1  [32])local_120);
  auVar8 = vpsubd_avx2((undefined1  [32])local_120,local_100);
  auVar3 = vpaddd_avx2(local_c0,local_e0);
  auVar9 = vpsubd_avx2(local_e0,local_c0);
  auVar4 = vpaddd_avx2(local_80,local_a0);
  auVar10 = vpsubd_avx2(local_a0,local_80);
  auVar5 = vpaddd_avx2(local_40,local_60);
  auVar11 = vpsubd_avx2(local_60,local_40);
  auVar6 = vpaddd_avx2(auVar2,auVar3);
  auVar7 = vpaddd_avx2(auVar9,auVar8);
  auVar12 = vpsubd_avx2(auVar2,auVar3);
  auVar13 = vpsubd_avx2(auVar8,auVar9);
  auVar2 = vpaddd_avx2(auVar5,auVar4);
  auVar3 = vpaddd_avx2(auVar11,auVar10);
  auVar14 = vpsubd_avx2(auVar4,auVar5);
  auVar10 = vpsubd_avx2(auVar10,auVar11);
  auVar4 = vpaddd_avx2(auVar2,auVar6);
  auVar5 = vpaddd_avx2(auVar3,auVar7);
  auVar8 = vpaddd_avx2(auVar14,auVar12);
  auVar9 = vpaddd_avx2(auVar10,auVar13);
  auVar2 = vpsubd_avx2(auVar6,auVar2);
  auVar3 = vpsubd_avx2(auVar7,auVar3);
  auVar6 = vpsubd_avx2(auVar12,auVar14);
  auVar7 = vpsubd_avx2(auVar13,auVar10);
  local_120[0] = auVar4._0_8_;
  local_120[1] = auVar4._8_8_;
  local_120[2] = auVar4._16_8_;
  local_120[3] = auVar4._24_8_;
  *(longlong *)coeff = local_120[0];
  *(longlong *)(coeff + 2) = local_120[1];
  *(longlong *)(coeff + 4) = local_120[2];
  *(longlong *)(coeff + 6) = local_120[3];
  *(undefined1 (*) [32])(coeff + 8) = auVar6;
  local_e0._0_8_ = auVar2._0_8_;
  local_e0._8_8_ = auVar2._8_8_;
  local_e0._16_8_ = auVar2._16_8_;
  local_e0._24_8_ = auVar2._24_8_;
  *(undefined8 *)(coeff + 0x10) = local_e0._0_8_;
  *(undefined8 *)(coeff + 0x12) = local_e0._8_8_;
  *(undefined8 *)(coeff + 0x14) = local_e0._16_8_;
  *(undefined8 *)(coeff + 0x16) = local_e0._24_8_;
  local_c0._0_8_ = auVar8._0_8_;
  local_c0._8_8_ = auVar8._8_8_;
  local_c0._16_8_ = auVar8._16_8_;
  local_c0._24_8_ = auVar8._24_8_;
  *(undefined8 *)(coeff + 0x18) = local_c0._0_8_;
  *(undefined8 *)(coeff + 0x1a) = local_c0._8_8_;
  *(undefined8 *)(coeff + 0x1c) = local_c0._16_8_;
  *(undefined8 *)(coeff + 0x1e) = local_c0._24_8_;
  local_a0._0_8_ = auVar9._0_8_;
  local_a0._8_8_ = auVar9._8_8_;
  local_a0._16_8_ = auVar9._16_8_;
  local_a0._24_8_ = auVar9._24_8_;
  *(undefined8 *)(coeff + 0x20) = local_a0._0_8_;
  *(undefined8 *)(coeff + 0x22) = local_a0._8_8_;
  *(undefined8 *)(coeff + 0x24) = local_a0._16_8_;
  *(undefined8 *)(coeff + 0x26) = local_a0._24_8_;
  local_80._0_8_ = auVar7._0_8_;
  local_80._8_8_ = auVar7._8_8_;
  local_80._16_8_ = auVar7._16_8_;
  local_80._24_8_ = auVar7._24_8_;
  *(undefined8 *)(coeff + 0x28) = local_80._0_8_;
  *(undefined8 *)(coeff + 0x2a) = local_80._8_8_;
  *(undefined8 *)(coeff + 0x2c) = local_80._16_8_;
  *(undefined8 *)(coeff + 0x2e) = local_80._24_8_;
  local_60._0_8_ = auVar3._0_8_;
  local_60._8_8_ = auVar3._8_8_;
  local_60._16_8_ = auVar3._16_8_;
  local_60._24_8_ = auVar3._24_8_;
  *(undefined8 *)(coeff + 0x30) = local_60._0_8_;
  *(undefined8 *)(coeff + 0x32) = local_60._8_8_;
  *(undefined8 *)(coeff + 0x34) = local_60._16_8_;
  *(undefined8 *)(coeff + 0x36) = local_60._24_8_;
  local_40._0_8_ = auVar5._0_8_;
  local_40._8_8_ = auVar5._8_8_;
  local_40._16_8_ = auVar5._16_8_;
  local_40._24_8_ = auVar5._24_8_;
  *(undefined8 *)(coeff + 0x38) = local_40._0_8_;
  *(undefined8 *)(coeff + 0x3a) = local_40._8_8_;
  *(undefined8 *)(coeff + 0x3c) = local_40._16_8_;
  *(undefined8 *)(coeff + 0x3e) = local_40._24_8_;
  return;
}

Assistant:

void aom_highbd_hadamard_8x8_avx2(const int16_t *src_diff, ptrdiff_t src_stride,
                                  tran_low_t *coeff) {
  __m128i src16[8];
  __m256i src32[8];

  src16[0] = _mm_loadu_si128((const __m128i *)src_diff);
  src16[1] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[2] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[3] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[4] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[5] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[6] = _mm_loadu_si128((const __m128i *)(src_diff += src_stride));
  src16[7] = _mm_loadu_si128((const __m128i *)(src_diff + src_stride));

  src32[0] = _mm256_cvtepi16_epi32(src16[0]);
  src32[1] = _mm256_cvtepi16_epi32(src16[1]);
  src32[2] = _mm256_cvtepi16_epi32(src16[2]);
  src32[3] = _mm256_cvtepi16_epi32(src16[3]);
  src32[4] = _mm256_cvtepi16_epi32(src16[4]);
  src32[5] = _mm256_cvtepi16_epi32(src16[5]);
  src32[6] = _mm256_cvtepi16_epi32(src16[6]);
  src32[7] = _mm256_cvtepi16_epi32(src16[7]);

  highbd_hadamard_col8_avx2(src32, 0);
  highbd_hadamard_col8_avx2(src32, 1);

  _mm256_storeu_si256((__m256i *)coeff, src32[0]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[1]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[2]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[3]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[4]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[5]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[6]);
  coeff += 8;
  _mm256_storeu_si256((__m256i *)coeff, src32[7]);
}